

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_iterator pEVar4;
  const_iterator __ofirst;
  iterator pEVar5;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  iterator newEnd;
  Entry *in_stack_ffffffffffffff58;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_ffffffffffffff60;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_ffffffffffffff68;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_ffffffffffffff70;
  const_iterator in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  
  if (in_RDI != in_RSI) {
    uVar1 = in_RDI->len;
    sVar2 = size(in_RSI);
    if (uVar1 < sVar2) {
      sVar2 = capacity(in_RDI);
      sVar3 = size(in_RSI);
      if (sVar2 < sVar3) {
        clear(in_stack_ffffffffffffff60);
        size(in_RSI);
        reserve(in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      }
      else if (in_RDI->len != 0) {
        in_stack_ffffffffffffff78 = begin(in_RSI);
        in_stack_ffffffffffffff80 = begin(in_RSI);
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + in_RDI->len;
        begin(in_RDI);
        std::ranges::__copy_fn::
        operator()<const_slang::IntervalMapDetails::Path::Entry_*,_const_slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*>
                  ((__copy_fn *)in_stack_ffffffffffffff70,(Entry *)in_stack_ffffffffffffff68,
                   (Entry *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      pEVar4 = begin(in_RSI);
      pEVar4 = pEVar4 + in_RDI->len;
      __ofirst = end(in_RSI);
      pEVar5 = begin(in_RDI);
      pEVar5 = pEVar5 + in_RDI->len;
      begin(in_RDI);
      size(in_RSI);
      std::ranges::__uninitialized_copy_fn::
      operator()<const_slang::IntervalMapDetails::Path::Entry_*,_const_slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*>
                ((__uninitialized_copy_fn *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 pEVar5,__ofirst,pEVar4);
      sVar2 = size(in_RSI);
      in_RDI->len = sVar2;
    }
    else {
      sVar2 = size(in_RSI);
      if (sVar2 == 0) {
        begin(in_RDI);
      }
      else {
        begin(in_RDI);
        std::ranges::__copy_fn::
        operator()<const_slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>_&,_slang::IntervalMapDetails::Path::Entry_*>
                  ((__copy_fn *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (Entry *)in_stack_ffffffffffffff60);
      }
      end(in_RDI);
      std::ranges::__destroy_fn::
      operator()<slang::IntervalMapDetails::Path::Entry_*,_slang::IntervalMapDetails::Path::Entry_*>
                ((__destroy_fn *)in_stack_ffffffffffffff70,(Entry *)in_stack_ffffffffffffff68,
                 (Entry *)in_stack_ffffffffffffff60);
      sVar2 = size(in_RSI);
      in_RDI->len = sVar2;
    }
  }
  return in_RDI;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}